

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void * matras_allocator_alloc(matras_allocator *allocator)

{
  void *ext;
  matras_allocator *allocator_local;
  
  if (allocator->num_reserved_extents < 1) {
    allocator_local = (matras_allocator *)(*allocator->alloc_func)(allocator);
  }
  else {
    allocator_local = (matras_allocator *)allocator->reserved_extents;
    allocator->reserved_extents = (void *)allocator_local->extent_size;
    allocator->num_reserved_extents = allocator->num_reserved_extents + -1;
  }
  return allocator_local;
}

Assistant:

void *
matras_allocator_alloc(struct matras_allocator *allocator)
{
	if (allocator->num_reserved_extents > 0) {
		void *ext = allocator->reserved_extents;
		allocator->reserved_extents = *(void **)ext;
		allocator->num_reserved_extents--;
		return ext;
	}
	return allocator->alloc_func(allocator);
}